

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

RPCHelpMan * getpeerinfo(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  string m_key_name_15;
  string m_key_name_16;
  string m_key_name_17;
  string m_key_name_18;
  string m_key_name_19;
  string m_key_name_20;
  string m_key_name_21;
  string m_key_name_22;
  string m_key_name_23;
  string m_key_name_24;
  string m_key_name_25;
  string m_key_name_26;
  string m_key_name_27;
  string m_key_name_28;
  string m_key_name_29;
  string m_key_name_30;
  string m_key_name_31;
  string m_key_name_32;
  string m_key_name_33;
  string m_key_name_34;
  string m_key_name_35;
  string m_key_name_36;
  string m_key_name_37;
  string m_key_name_38;
  string m_key_name_39;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  string description_19;
  string description_20;
  string description_21;
  string description_22;
  string description_23;
  string description_24;
  string description_25;
  string description_26;
  string description_27;
  string description_28;
  string description_29;
  string description_30;
  string description_31;
  string description_32;
  string description_33;
  string description_34;
  string description_35;
  string description_36;
  string description_37;
  string description_38;
  string description_39;
  string description_40;
  string description_41;
  string description_42;
  string description_43;
  string description_44;
  string description_45;
  string description_46;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_19;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_20;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_21;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_22;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_23;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_24;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_25;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_26;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_27;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_28;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_29;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_30;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_31;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_32;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_33;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_34;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_35;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_36;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_37;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_38;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_39;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_40;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_41;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_42;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_43;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_44;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_45;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  long lVar7;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<RPCResult> __l_05;
  undefined4 in_stack_ffffffffffffd1b8;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffd1bc;
  undefined8 in_stack_ffffffffffffd1c0;
  undefined8 in_stack_ffffffffffffd1c8;
  undefined8 in_stack_ffffffffffffd1d0;
  _Manager_type in_stack_ffffffffffffd1d8;
  undefined8 in_stack_ffffffffffffd1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffd1e8;
  pointer in_stack_ffffffffffffd1f8;
  pointer pRVar9;
  pointer in_stack_ffffffffffffd200;
  pointer pRVar10;
  pointer in_stack_ffffffffffffd208;
  pointer pRVar11;
  undefined8 in_stack_ffffffffffffd210;
  pointer pRVar12;
  pointer pRVar13;
  pointer pRVar14;
  undefined8 in_stack_ffffffffffffd230;
  pointer pRVar15;
  pointer pRVar16;
  pointer pRVar17;
  undefined8 in_stack_ffffffffffffd250;
  pointer pRVar18;
  pointer pRVar19;
  allocator<char> local_2d89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d88;
  allocator<char> local_2d6b;
  allocator<char> local_2d6a;
  allocator_type local_2d69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d68;
  allocator<char> local_2d4a;
  allocator<char> local_2d49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d48;
  allocator<char> local_2d2a;
  allocator<char> local_2d29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d28;
  allocator<char> local_2d0b;
  allocator<char> local_2d0a;
  allocator_type local_2d09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2d08;
  allocator<char> local_2ce9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ce8;
  allocator<char> local_2cca;
  allocator<char> local_2cc9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2cc8;
  allocator<char> local_2caa;
  allocator<char> local_2ca9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ca8;
  allocator<char> local_2c8a;
  allocator<char> local_2c89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c88;
  allocator<char> local_2c6b;
  allocator<char> local_2c6a;
  allocator_type local_2c69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c68;
  allocator<char> local_2c4a;
  allocator<char> local_2c49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c48;
  allocator<char> local_2c2a;
  allocator<char> local_2c29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c28;
  allocator<char> local_2c0a;
  allocator<char> local_2c09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2c08;
  allocator<char> local_2bea;
  allocator<char> local_2be9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2be8;
  allocator<char> local_2bca;
  allocator<char> local_2bc9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2bc8;
  allocator<char> local_2baa;
  allocator<char> local_2ba9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ba8;
  allocator<char> local_2b8a;
  allocator<char> local_2b89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b88;
  allocator<char> local_2b6a;
  allocator<char> local_2b69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b68;
  allocator<char> local_2b4a;
  allocator<char> local_2b49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b48;
  allocator<char> local_2b2a;
  allocator<char> local_2b29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b28;
  allocator<char> local_2b0a;
  allocator<char> local_2b09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2b08;
  allocator<char> local_2aea;
  allocator<char> local_2ae9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ae8;
  allocator<char> local_2aca;
  allocator<char> local_2ac9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2ac8;
  allocator<char> local_2aaa;
  allocator<char> local_2aa9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2aa8;
  allocator<char> local_2a8a;
  allocator<char> local_2a89;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a88;
  allocator<char> local_2a69;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a68;
  allocator<char> local_2a4a;
  allocator<char> local_2a49;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a48;
  allocator<char> local_2a2a;
  allocator<char> local_2a29;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a28;
  allocator<char> local_2a09;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2a08;
  allocator<char> local_29e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29e8;
  allocator<char> local_29c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29c8;
  allocator<char> local_29a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_29a8;
  allocator<char> local_298b;
  allocator<char> local_298a;
  allocator_type local_2989;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2988;
  allocator<char> local_296a;
  allocator<char> local_2969;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2968;
  allocator<char> local_294a;
  allocator<char> local_2949;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2948;
  allocator<char> local_292a;
  allocator<char> local_2929;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2928;
  allocator<char> local_290a;
  allocator<char> local_2909;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2908;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28e8;
  allocator<char> local_28c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28c8;
  allocator<char> local_28aa;
  allocator<char> local_28a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_28a8;
  allocator<char> local_288a;
  allocator<char> local_2889;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2888;
  allocator<char> local_286a;
  allocator<char> local_2869;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2868;
  allocator<char> local_2842;
  allocator<char> local_2841;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2840;
  allocator<char> local_2822;
  allocator<char> local_2821;
  vector<RPCResult,_std::allocator<RPCResult>_> local_2820;
  allocator<char> local_2802;
  allocator<char> local_2801;
  RPCResults local_2800;
  vector<RPCArg,_std::allocator<RPCArg>_> local_27e8;
  allocator<char> local_27ca;
  allocator<char> local_27c9;
  string local_27c8;
  string local_27a8;
  string local_2788;
  string local_2768;
  string local_2748;
  string local_2728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2708;
  char *local_26e8;
  size_type local_26e0;
  char local_26d8 [8];
  undefined8 uStack_26d0;
  string local_26c8 [32];
  string local_26a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2668;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2648;
  string local_2628 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25c8;
  string local_25a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2568;
  string local_2548 [32];
  RPCResult local_2528;
  string local_24a0 [32];
  string local_2480 [32];
  string local_2460 [32];
  string local_2440 [32];
  RPCResult local_2420;
  string local_2398 [32];
  string local_2378 [32];
  string local_2358 [32];
  string local_2338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_22f8;
  string local_22d8 [32];
  RPCResult local_22b8;
  string local_2230 [32];
  string local_2210 [32];
  string local_21f0 [32];
  string local_21d0 [32];
  string local_21b0 [32];
  string local_2190 [32];
  string local_2170 [32];
  string local_2150 [32];
  string local_2130 [32];
  string local_2110 [32];
  RPCResult local_20f0;
  string local_2068 [32];
  string local_2048 [32];
  undefined8 local_2028 [4];
  string local_2008 [32];
  string local_1fe8 [32];
  string local_1fc8 [32];
  string local_1fa8 [32];
  string local_1f88 [32];
  string local_1f68 [32];
  string local_1f48 [32];
  string local_1f28 [32];
  string local_1f08 [32];
  string local_1ee8 [32];
  string local_1ec8 [32];
  string local_1ea8 [32];
  string local_1e88 [32];
  string local_1e68 [32];
  string local_1e48 [32];
  string local_1e28 [32];
  string local_1e08 [32];
  string local_1de8 [32];
  string local_1dc8 [32];
  string local_1da8 [32];
  string local_1d88 [32];
  string local_1d68 [32];
  string local_1d48 [32];
  string local_1d28 [32];
  string local_1d08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1cc8;
  string local_1ca8 [32];
  string local_1c88 [32];
  string local_1c68 [32];
  string local_1c48 [32];
  string local_1c28 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1be8;
  string local_1bc8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ba8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b88;
  string local_1b68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b28;
  string local_1b08 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ae8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1ac8;
  string local_1aa8 [32];
  string local_1a88 [32];
  string local_1a68 [32];
  string local_1a48 [32];
  string local_1a28 [32];
  RPCResult local_1a08;
  string local_1980 [32];
  string local_1960 [32];
  string local_1940 [32];
  string local_1920 [32];
  string local_1900 [32];
  string local_18e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_18a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1880;
  string local_1860 [32];
  string local_1840 [32];
  string local_1820 [32];
  string local_1800 [32];
  string local_17e0 [32];
  string local_17c0 [32];
  string local_17a0 [32];
  string local_1780 [32];
  string local_1760 [32];
  RPCResult local_1740 [4];
  RPCResult local_1520;
  RPCResult local_1498;
  RPCResult local_1410;
  RPCResult local_1388;
  RPCResult local_1300;
  RPCResult local_1278;
  RPCResult local_11f0;
  RPCResult local_1168;
  RPCResult local_10e0;
  RPCResult local_1058;
  RPCResult local_fd0;
  RPCResult local_f48;
  RPCResult local_ec0;
  RPCResult local_e38;
  RPCResult local_db0;
  RPCResult local_d28;
  RPCResult local_ca0;
  RPCResult local_c18;
  RPCResult local_b90;
  RPCResult local_b08;
  RPCResult local_a80;
  RPCResult local_9f8;
  RPCResult local_970;
  RPCResult local_8e8;
  RPCResult local_860;
  RPCResult local_7d8;
  RPCResult local_750;
  RPCResult local_6c8;
  RPCResult local_640;
  RPCResult local_5b8;
  RPCResult local_530;
  RPCResult local_4a8;
  RPCResult local_420;
  RPCResult local_398;
  RPCResult local_310;
  RPCResult local_288;
  string local_200 [32];
  string local_1e0 [32];
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_1058.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2028[0] = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getpeerinfo",&local_27c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"Returns data about each connected network peer as a json array of objects.",
             &local_27ca);
  local_27e8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_27e8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_27e8.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_118,"",&local_2801);
  std::__cxx11::string::string<std::allocator<char>>(local_138,"",&local_2802);
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"",&local_2821);
  std::__cxx11::string::string<std::allocator<char>>(local_200,"",&local_2822);
  std::__cxx11::string::string<std::allocator<char>>(local_1760,"id",&local_2841);
  std::__cxx11::string::string<std::allocator<char>>(local_1780,"Peer index",&local_2842);
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2868.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd1b8;
  m_key_name._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description._M_string_length = in_stack_ffffffffffffd1e0;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description.field_2 = in_stack_ffffffffffffd1e8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffd200;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffd1f8;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(local_1740,NUM,m_key_name,description,inner,SUB81(local_1760,0));
  std::__cxx11::string::string<std::allocator<char>>(local_17a0,"addr",&local_2869);
  std::__cxx11::string::string<std::allocator<char>>
            (local_17c0,"(host:port) The IP address and port of the peer",&local_286a);
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2888.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffd1b8;
  m_key_name_00._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_00._M_string_length = in_stack_ffffffffffffd1e0;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_00.field_2 = in_stack_ffffffffffffd1e8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(local_1740 + 1,STR,m_key_name_00,description_00,inner_00,SUB81(local_17a0,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_17e0,"addrbind",&local_2889);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1800,"(ip:port) Bind address of the connection to the peer",&local_288a);
  local_28a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_8_ = in_stack_ffffffffffffd1c0;
  auVar1._0_4_ = in_stack_ffffffffffffd1bc;
  auVar1._12_8_ = in_stack_ffffffffffffd1c8;
  auVar1._20_8_ = in_stack_ffffffffffffd1d0;
  auVar1._28_4_ = 0;
  description_01._M_string_length = in_stack_ffffffffffffd1e0;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_01.field_2 = in_stack_ffffffffffffd1e8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (local_1740 + 2,STR,(string)(auVar1 << 0x20),SUB81(local_17e0,0),description_01,inner_01
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1820,"addrlocal",&local_28a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1840,"(ip:port) Local address as reported by the peer",&local_28aa);
  local_28c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  auVar2._4_8_ = in_stack_ffffffffffffd1c0;
  auVar2._0_4_ = in_stack_ffffffffffffd1bc;
  auVar2._12_8_ = in_stack_ffffffffffffd1c8;
  auVar2._20_8_ = in_stack_ffffffffffffd1d0;
  auVar2._28_4_ = 0;
  description_02._M_string_length = in_stack_ffffffffffffd1e0;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_02.field_2 = in_stack_ffffffffffffd1e8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (local_1740 + 3,STR,(string)(auVar2 << 0x20),SUB81(local_1820,0),description_02,inner_02
             ,true);
  std::__cxx11::string::string<std::allocator<char>>(local_1860,"network",&local_28c9);
  GetNetworkNames_abi_cxx11_(&local_28e8,true);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_18c0,(util *)&local_28e8,", ");
  std::operator+(&local_18a0,"Network (",&local_18c0);
  std::operator+(&local_1880,&local_18a0,")");
  local_2908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2908.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_01._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_03._M_string_length = in_stack_ffffffffffffd1e0;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_03.field_2 = in_stack_ffffffffffffd1e8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_1520,STR,m_key_name_01,description_03,inner_03,SUB81(local_1860,0));
  std::__cxx11::string::string<std::allocator<char>>(local_18e0,"mapped_as",&local_2909);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1900,
             "The AS in the BGP route to the peer used for diversifying\npeer selection (only available if the asmap config flag is set)"
             ,&local_290a);
  local_2928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2928.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  auVar3._4_8_ = in_stack_ffffffffffffd1c0;
  auVar3._0_4_ = in_stack_ffffffffffffd1bc;
  auVar3._12_8_ = in_stack_ffffffffffffd1c8;
  auVar3._20_8_ = in_stack_ffffffffffffd1d0;
  auVar3._28_4_ = 0;
  description_04._M_string_length = in_stack_ffffffffffffd1e0;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_04.field_2 = in_stack_ffffffffffffd1e8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_1498,NUM,(string)(auVar3 << 0x20),SUB81(local_18e0,0),description_04,inner_04,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1920,"services",&local_2929);
  std::__cxx11::string::string<std::allocator<char>>(local_1940,"The services offered",&local_292a);
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2948.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_02._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_02._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_05._M_string_length = in_stack_ffffffffffffd1e0;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_05.field_2 = in_stack_ffffffffffffd1e8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_1410,STR_HEX,m_key_name_02,description_05,inner_05,SUB81(local_1920,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1960,"servicesnames",&local_2949);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1980,"the services offered, in human-readable form",&local_294a);
  std::__cxx11::string::string<std::allocator<char>>(local_1a28,"SERVICE_NAME",&local_2969);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a48,"the service name if it is recognised",&local_296a);
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2988.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_03._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_03._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_06._M_string_length = in_stack_ffffffffffffd1e0;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_06.field_2 = in_stack_ffffffffffffd1e8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_1a08,STR,m_key_name_03,description_06,inner_06,SUB81(local_1a28,0));
  __l._M_len = 1;
  __l._M_array = &local_1a08;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2968,__l,&local_2989);
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_04._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_04._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_07._M_string_length = in_stack_ffffffffffffd1e0;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_07.field_2 = in_stack_ffffffffffffd1e8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_1388,ARR,m_key_name_04,description_07,inner_07,SUB81(local_1960,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1a68,"relaytxes",&local_298a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1a88,"Whether we relay transactions to this peer",&local_298b);
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_05._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_05._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_08._M_string_length = in_stack_ffffffffffffd1e0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_08.field_2 = in_stack_ffffffffffffd1e8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_1300,BOOL,m_key_name_05,description_08,inner_08,SUB81(local_1a68,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1aa8,"lastsend",&local_29a9);
  std::operator+(&local_1ae8,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_1ac8,&local_1ae8," of the last send");
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_06._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_06._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_09._M_string_length = in_stack_ffffffffffffd1e0;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_09.field_2 = in_stack_ffffffffffffd1e8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_1278,NUM_TIME,m_key_name_06,description_09,inner_09,SUB81(local_1aa8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1b08,"lastrecv",&local_29c9);
  std::operator+(&local_1b48,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_1b28,&local_1b48," of the last receive");
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_07._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_07._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_10._M_string_length = in_stack_ffffffffffffd1e0;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_10.field_2 = in_stack_ffffffffffffd1e8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_11f0,NUM_TIME,m_key_name_07,description_10,inner_10,SUB81(local_1b08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1b68,"last_transaction",&local_29e9);
  std::operator+(&local_1ba8,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_1b88,&local_1ba8," of the last valid transaction received from this peer");
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_08._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_08._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_11._M_string_length = in_stack_ffffffffffffd1e0;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_11.field_2 = in_stack_ffffffffffffd1e8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_1168,NUM_TIME,m_key_name_08,description_11,inner_11,SUB81(local_1b68,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1bc8,"last_block",&local_2a09);
  std::operator+(&local_1c08,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_1be8,&local_1c08," of the last block received from this peer");
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_09._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_09._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_12._M_string_length = in_stack_ffffffffffffd1e0;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_12.field_2 = in_stack_ffffffffffffd1e8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_10e0,NUM_TIME,m_key_name_09,description_12,inner_12,SUB81(local_1bc8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1c28,"bytessent",&local_2a29);
  std::__cxx11::string::string<std::allocator<char>>(local_1c48,"The total bytes sent",&local_2a2a);
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_10._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_10._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_13._M_string_length = in_stack_ffffffffffffd1e0;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_13.field_2 = in_stack_ffffffffffffd1e8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_1058,NUM,m_key_name_10,description_13,inner_13,SUB81(local_1c28,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1c68,"bytesrecv",&local_2a49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1c88,"The total bytes received",&local_2a4a);
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_11._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_11._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_14._M_string_length = in_stack_ffffffffffffd1e0;
  description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_14.field_2 = in_stack_ffffffffffffd1e8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_fd0,NUM,m_key_name_11,description_14,inner_14,SUB81(local_1c68,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1ca8,"conntime",&local_2a69);
  std::operator+(&local_1ce8,"The ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_1cc8,&local_1ce8," of the connection");
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_12._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_12._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_12.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_15._M_string_length = in_stack_ffffffffffffd1e0;
  description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_15.field_2 = in_stack_ffffffffffffd1e8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_f48,NUM_TIME,m_key_name_12,description_15,inner_15,SUB81(local_1ca8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1d08,"timeoffset",&local_2a89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d28,"The time offset in seconds",&local_2a8a);
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2aa8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_13._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_13._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_13.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_16._M_string_length = in_stack_ffffffffffffd1e0;
  description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_16.field_2 = in_stack_ffffffffffffd1e8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_ec0,NUM,m_key_name_13,description_16,inner_16,SUB81(local_1d08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1d48,"pingtime",&local_2aa9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d68,"The last ping time in milliseconds (ms), if any",&local_2aaa);
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ac8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar4._4_8_ = in_stack_ffffffffffffd1c0;
  auVar4._0_4_ = in_stack_ffffffffffffd1bc;
  auVar4._12_8_ = in_stack_ffffffffffffd1c8;
  auVar4._20_8_ = in_stack_ffffffffffffd1d0;
  auVar4._28_4_ = 0;
  description_17._M_string_length = in_stack_ffffffffffffd1e0;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_17.field_2 = in_stack_ffffffffffffd1e8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_e38,NUM,(string)(auVar4 << 0x20),SUB81(local_1d48,0),description_17,inner_17,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1d88,"minping",&local_2ac9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1da8,"The minimum observed ping time in milliseconds (ms), if any",&local_2aca);
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ae8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar5._4_8_ = in_stack_ffffffffffffd1c0;
  auVar5._0_4_ = in_stack_ffffffffffffd1bc;
  auVar5._12_8_ = in_stack_ffffffffffffd1c8;
  auVar5._20_8_ = in_stack_ffffffffffffd1d0;
  auVar5._28_4_ = 0;
  description_18._M_string_length = in_stack_ffffffffffffd1e0;
  description_18._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_18.field_2 = in_stack_ffffffffffffd1e8;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_18.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_db0,NUM,(string)(auVar5 << 0x20),SUB81(local_1d88,0),description_18,inner_18,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1dc8,"pingwait",&local_2ae9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1de8,"The duration in milliseconds (ms) of an outstanding ping (if non-zero)",
             &local_2aea);
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar8 = 0;
  auVar6._4_8_ = in_stack_ffffffffffffd1c0;
  auVar6._0_4_ = in_stack_ffffffffffffd1bc;
  auVar6._12_8_ = in_stack_ffffffffffffd1c8;
  auVar6._20_8_ = in_stack_ffffffffffffd1d0;
  auVar6._28_4_ = 0;
  description_19._M_string_length = in_stack_ffffffffffffd1e0;
  description_19._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_19.field_2 = in_stack_ffffffffffffd1e8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_19.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult
            (&local_d28,NUM,(string)(auVar6 << 0x20),SUB81(local_1dc8,0),description_19,inner_19,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_1e08,"version",&local_2b09);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1e28,"The peer version, such as 70001",&local_2b0a);
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_14._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_14._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_14.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_20._M_string_length = in_stack_ffffffffffffd1e0;
  description_20._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_20.field_2 = in_stack_ffffffffffffd1e8;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_20.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_ca0,NUM,m_key_name_14,description_20,inner_20,SUB81(local_1e08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1e48,"subver",&local_2b29);
  std::__cxx11::string::string<std::allocator<char>>(local_1e68,"The string version",&local_2b2a);
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b48.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_15._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_15._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_15._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_15.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_15.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_21._M_string_length = in_stack_ffffffffffffd1e0;
  description_21._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_21.field_2 = in_stack_ffffffffffffd1e8;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_21.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_c18,STR,m_key_name_15,description_21,inner_21,SUB81(local_1e48,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1e88,"inbound",&local_2b49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ea8,"Inbound (true) or Outbound (false)",&local_2b4a);
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_16._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_16._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_16._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_16.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_16.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_22._M_string_length = in_stack_ffffffffffffd1e0;
  description_22._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_22.field_2 = in_stack_ffffffffffffd1e8;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_22.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_b90,BOOL,m_key_name_16,description_22,inner_22,SUB81(local_1e88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1ec8,"bip152_hb_to",&local_2b69);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1ee8,"Whether we selected peer as (compact blocks) high-bandwidth peer",
             &local_2b6a);
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_17._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_17._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_17._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_17.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_17.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_23._M_string_length = in_stack_ffffffffffffd1e0;
  description_23._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_23.field_2 = in_stack_ffffffffffffd1e8;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_23.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_b08,BOOL,m_key_name_17,description_23,inner_23,SUB81(local_1ec8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1f08,"bip152_hb_from",&local_2b89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f28,"Whether peer selected us as (compact blocks) high-bandwidth peer",
             &local_2b8a);
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ba8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_18._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_18._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_18._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_18.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_18.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_24._M_string_length = in_stack_ffffffffffffd1e0;
  description_24._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_24.field_2 = in_stack_ffffffffffffd1e8;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_24.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_a80,BOOL,m_key_name_18,description_24,inner_24,SUB81(local_1f08,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1f48,"startingheight",&local_2ba9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f68,"The starting height (block) of the peer",&local_2baa);
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2bc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_19._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_19._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_19._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_19.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_19.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_25._M_string_length = in_stack_ffffffffffffd1e0;
  description_25._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_25.field_2 = in_stack_ffffffffffffd1e8;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_25.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_9f8,NUM,m_key_name_19,description_25,inner_25,SUB81(local_1f48,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1f88,"presynced_headers",&local_2bc9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1fa8,
             "The current height of header pre-synchronization with this peer, or -1 if no low-work sync is in progress"
             ,&local_2bca);
  local_2be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2be8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_20._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_20._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_20._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_20.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_20.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_26._M_string_length = in_stack_ffffffffffffd1e0;
  description_26._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_26.field_2 = in_stack_ffffffffffffd1e8;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_26.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_970,NUM,m_key_name_20,description_26,inner_26,SUB81(local_1f88,0));
  std::__cxx11::string::string<std::allocator<char>>(local_1fc8,"synced_headers",&local_2be9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1fe8,"The last header we have in common with this peer",&local_2bea);
  local_2c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_21._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_21._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_21._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_21.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_21.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_27._M_string_length = in_stack_ffffffffffffd1e0;
  description_27._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_27.field_2 = in_stack_ffffffffffffd1e8;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_27.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_8e8,NUM,m_key_name_21,description_27,inner_27,SUB81(local_1fc8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2008,"synced_blocks",&local_2c09);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2028,"The last block we have in common with this peer",&local_2c0a);
  local_2c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_22._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_22._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_22._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_22.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_22.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_28._M_string_length = in_stack_ffffffffffffd1e0;
  description_28._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_28.field_2 = in_stack_ffffffffffffd1e8;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_860,NUM,m_key_name_22,description_28,inner_28,SUB81(local_2008,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2048,"inflight",&local_2c29);
  std::__cxx11::string::string<std::allocator<char>>(local_2068,"",&local_2c2a);
  std::__cxx11::string::string<std::allocator<char>>(local_2110,"n",&local_2c49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2130,"The heights of blocks we\'re currently asking from this peer",&local_2c4a);
  local_2c68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_23._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_23._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_23._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_23.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_23.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_29._M_string_length = in_stack_ffffffffffffd1e0;
  description_29._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_29.field_2 = in_stack_ffffffffffffd1e8;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_29.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_20f0,NUM,m_key_name_23,description_29,inner_29,SUB81(local_2110,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_20f0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2c48,__l_00,&local_2c69);
  m_key_name_24._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_24._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_24._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_24.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_24.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_30._M_string_length = in_stack_ffffffffffffd1e0;
  description_30._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_30.field_2 = in_stack_ffffffffffffd1e8;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_30.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_7d8,ARR,m_key_name_24,description_30,inner_30,SUB81(local_2048,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2150,"addr_relay_enabled",&local_2c6a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2170,"Whether we participate in address relay with this peer",&local_2c6b);
  local_2c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c88.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_25._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_25._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_25._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_25.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_25.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_31._M_string_length = in_stack_ffffffffffffd1e0;
  description_31._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_31.field_2 = in_stack_ffffffffffffd1e8;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_31.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_750,BOOL,m_key_name_25,description_31,inner_31,SUB81(local_2150,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2190,"addr_processed",&local_2c89);
  std::__cxx11::string::string<std::allocator<char>>
            (local_21b0,
             "The total number of addresses processed, excluding those dropped due to rate limiting"
             ,&local_2c8a);
  local_2ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2ca8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_26._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_26._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_26._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_26.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_26.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_32._M_string_length = in_stack_ffffffffffffd1e0;
  description_32._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_32.field_2 = in_stack_ffffffffffffd1e8;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_32.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_6c8,NUM,m_key_name_26,description_32,inner_32,SUB81(local_2190,0));
  std::__cxx11::string::string<std::allocator<char>>(local_21d0,"addr_rate_limited",&local_2ca9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_21f0,"The total number of addresses dropped due to rate limiting",&local_2caa);
  local_2cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2cc8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_27._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_27._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_27._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_27.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_27.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_33._M_string_length = in_stack_ffffffffffffd1e0;
  description_33._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_33.field_2 = in_stack_ffffffffffffd1e8;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_33.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_640,NUM,m_key_name_27,description_33,inner_33,SUB81(local_21d0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2210,"permissions",&local_2cc9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2230,"Any special permissions that have been granted to this peer",&local_2cca);
  std::__cxx11::string::string<std::allocator<char>>(local_22d8,"permission_type",&local_2ce9);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_2318,(util *)&NET_PERMISSIONS_DOC_abi_cxx11_,",\n");
  std::operator+(&local_22f8,&local_2318,".\n");
  local_2d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_28._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_28._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_28._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_28.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_28.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_34._M_string_length = in_stack_ffffffffffffd1e0;
  description_34._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_34.field_2 = in_stack_ffffffffffffd1e8;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_34.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_22b8,STR,m_key_name_28,description_34,inner_34,SUB81(local_22d8,0));
  __l_01._M_len = 1;
  __l_01._M_array = &local_22b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2ce8,__l_01,&local_2d09);
  m_key_name_29._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_29._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_29._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_29.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_29.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_35._M_string_length = in_stack_ffffffffffffd1e0;
  description_35._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_35.field_2 = in_stack_ffffffffffffd1e8;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_35.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_5b8,ARR,m_key_name_29,description_35,inner_35,SUB81(local_2210,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2338,"minfeefilter",&local_2d0a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2358,"The minimum fee rate for transactions this peer accepts",&local_2d0b);
  local_2d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d28.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_30._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_30._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_30._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_30.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_30.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_36._M_string_length = in_stack_ffffffffffffd1e0;
  description_36._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_36.field_2 = in_stack_ffffffffffffd1e8;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_36.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_530,NUM,m_key_name_30,description_36,inner_36,SUB81(local_2338,0));
  std::__cxx11::string::string<std::allocator<char>>(local_2378,"bytessent_per_msg",&local_2d29);
  std::__cxx11::string::string<std::allocator<char>>(local_2398,"",&local_2d2a);
  std::__cxx11::string::string<std::allocator<char>>(local_2440,"msg",&local_2d49);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2460,
             "The total bytes sent aggregated by message type\nWhen a message type is not listed in this json object, the bytes sent are 0.\nOnly known message types can appear as keys in the object."
             ,&local_2d4a);
  local_2d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2d68.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_31._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_31._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_31._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_31.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_31.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_37._M_string_length = in_stack_ffffffffffffd1e0;
  description_37._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_37.field_2 = in_stack_ffffffffffffd1e8;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_37.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_2420,NUM,m_key_name_31,description_37,inner_37,SUB81(local_2440,0));
  __l_02._M_len = 1;
  __l_02._M_array = &local_2420;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(&local_2d48,__l_02,&local_2d69);
  m_key_name_32._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_32._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_32._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_32.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_32.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_38._M_string_length = in_stack_ffffffffffffd1e0;
  description_38._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_38.field_2 = in_stack_ffffffffffffd1e8;
  inner_38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_4a8,OBJ_DYN,m_key_name_32,description_38,inner_38,SUB81(local_2378,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_2480,"bytesrecv_per_msg",&local_2d6a);
  std::__cxx11::string::string<std::allocator<char>>(local_24a0,"",&local_2d6b);
  std::__cxx11::string::string<std::allocator<char>>(local_2548,"msg",&local_2d89);
  std::operator+(&local_2588,
                 "The total bytes received aggregated by message type\nWhen a message type is not listed in this json object, the bytes received are 0.\nOnly known message types can appear as keys in the object and all bytes received\nof unknown message types are listed under \'"
                 ,&NET_MESSAGE_TYPE_OTHER_abi_cxx11_);
  std::operator+(&local_2568,&local_2588,"\'.");
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_33._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_33._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_33._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_33.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_33.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_39._M_string_length = in_stack_ffffffffffffd1e0;
  description_39._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_39.field_2 = in_stack_ffffffffffffd1e8;
  inner_39.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_39.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_39.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_2528,NUM,m_key_name_33,description_39,inner_39,SUB81(local_2548,0));
  __l_03._M_len = 1;
  __l_03._M_array = &local_2528;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2d88,__l_03,(allocator_type *)&stack0xffffffffffffd257);
  m_key_name_34._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_34._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_34._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_34.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_34.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_40._M_string_length = in_stack_ffffffffffffd1e0;
  description_40._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_40.field_2 = in_stack_ffffffffffffd1e8;
  inner_40.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_40.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_40.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_420,OBJ_DYN,m_key_name_34,description_40,inner_40,SUB81(local_2480,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>
            (local_25a8,"connection_type",(allocator<char> *)&stack0xffffffffffffd256);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_2608,(util *)&CONNECTION_TYPE_DOC_abi_cxx11_,",\n");
  std::operator+(&local_25e8,"Type of connection: \n",&local_2608);
  std::operator+(&local_25c8,&local_25e8,
                 ".\nPlease note this output is unlikely to be stable in upcoming releases as we iterate to\nbest capture connection behaviors."
                );
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  pRVar17 = (pointer)0x0;
  m_key_name_35._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_35._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_35._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_35.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_35.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_41._M_string_length = in_stack_ffffffffffffd1e0;
  description_41._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_41.field_2 = in_stack_ffffffffffffd1e8;
  inner_41.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_41.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_41.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_398,STR,m_key_name_35,description_41,inner_41,SUB81(local_25a8,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_2628,"transport_protocol_type",(allocator<char> *)&stack0xffffffffffffd237);
  util::
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3],util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,char_const(&)[3])::_lambda(auto:1_const&)_1_>
            (&local_2688,(util *)&TRANSPORT_TYPE_DOC_abi_cxx11_,",\n");
  std::operator+(&local_2668,"Type of transport protocol: \n",&local_2688);
  std::operator+(&local_2648,&local_2668,".\n");
  pRVar12 = (pointer)0x0;
  pRVar13 = (pointer)0x0;
  pRVar14 = (pointer)0x0;
  m_key_name_36._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_36._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_36._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_36.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_36.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_42._M_string_length = in_stack_ffffffffffffd1e0;
  description_42._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_42.field_2 = in_stack_ffffffffffffd1e8;
  inner_42.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffd200;
  inner_42.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffd1f8;
  inner_42.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_ffffffffffffd208;
  RPCResult::RPCResult(&local_310,STR,m_key_name_36,description_42,inner_42,SUB81(local_2628,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_26a8,"session_id",(allocator<char> *)&stack0xffffffffffffd217);
  std::__cxx11::string::string<std::allocator<char>>
            (local_26c8,
             "The session ID for this connection, or \"\" if there is none (\"v2\" transport protocol only).\n"
             ,(allocator<char> *)&stack0xffffffffffffd216);
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  pRVar11 = (pointer)0x0;
  m_key_name_37._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_37._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_37._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_37.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_37.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_43._M_string_length = in_stack_ffffffffffffd1e0;
  description_43._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_43.field_2._M_local_buf = in_stack_ffffffffffffd1e8._M_local_buf;
  inner_43.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_43.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_43.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_288,STR,m_key_name_37,description_43,inner_43,SUB81(local_26a8,0));
  __l_04._M_len = 0x28;
  __l_04._M_array = local_1740;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2840,__l_04,(allocator_type *)&stack0xffffffffffffd1f7);
  m_key_name_38._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_38._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_38._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_38.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_38.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_44._M_string_length = in_stack_ffffffffffffd1e0;
  description_44._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_44.field_2._M_local_buf = in_stack_ffffffffffffd1e8._M_local_buf;
  inner_44.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_44.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar9;
  inner_44.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  RPCResult::RPCResult(&local_1c0,OBJ,m_key_name_38,description_44,inner_44,SUB81(local_1e0,0));
  __l_05._M_len = 1;
  __l_05._M_array = &local_1c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_2820,__l_05,(allocator_type *)&stack0xffffffffffffd1f6);
  m_key_name_39._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffd1bc;
  m_key_name_39._M_dataplus._M_p._0_4_ = uVar8;
  m_key_name_39._M_string_length = in_stack_ffffffffffffd1c0;
  m_key_name_39.field_2._M_allocated_capacity = in_stack_ffffffffffffd1c8;
  m_key_name_39.field_2._8_8_ = in_stack_ffffffffffffd1d0;
  description_45._M_string_length = in_stack_ffffffffffffd1e0;
  description_45._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1d8;
  description_45.field_2 = in_stack_ffffffffffffd1e8;
  inner_45.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar10;
  inner_45.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar9;
  inner_45.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar11;
  RPCResult::RPCResult(&local_f8,ARR,m_key_name_39,description_45,inner_45,SUB81(local_118,0));
  result._4_4_ = in_stack_ffffffffffffd1bc;
  result.m_type = uVar8;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffd1c0;
  result.m_key_name._M_string_length = in_stack_ffffffffffffd1c8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffd1d0;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffd1d8;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd1e0;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffd1e8;
  result._64_8_ = pRVar9;
  result.m_description._M_dataplus._M_p = (pointer)pRVar10;
  result.m_description._M_string_length = (size_type)pRVar11;
  result.m_description.field_2._M_allocated_capacity = in_stack_ffffffffffffd210;
  result.m_description.field_2._8_8_ = pRVar12;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar13;
  result.m_cond._M_string_length = (size_type)pRVar14;
  result.m_cond.field_2._M_allocated_capacity = in_stack_ffffffffffffd230;
  result.m_cond.field_2._8_8_ = pRVar15;
  RPCResults::RPCResults(&local_2800,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2748,"getpeerinfo",(allocator<char> *)&stack0xffffffffffffd1f5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2768,"",(allocator<char> *)&stack0xffffffffffffd1f4);
  HelpExampleCli(&local_2728,&local_2748,&local_2768);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27a8,"getpeerinfo",(allocator<char> *)&stack0xffffffffffffd1f3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_27c8,"",(allocator<char> *)&stack0xffffffffffffd1f2);
  HelpExampleRpc(&local_2788,&local_27a8,&local_27c8);
  std::operator+(&local_2708,&local_2728,&local_2788);
  local_26e8 = local_26d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2708._M_dataplus._M_p == &local_2708.field_2) {
    uStack_26d0 = local_2708.field_2._8_8_;
  }
  else {
    local_26e8 = local_2708._M_dataplus._M_p;
  }
  local_26e0 = local_2708._M_string_length;
  local_2708._M_string_length = 0;
  local_2708.field_2._M_local_buf[0] = '\0';
  description_46._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:197:9)>
       ::_M_invoke;
  description_46._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:197:9)>
                ::_M_manager;
  description_46.field_2 = in_stack_ffffffffffffd1e8;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar10;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar9;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar11;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar12;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffd210;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar13;
  examples.m_examples._M_string_length = in_stack_ffffffffffffd230;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar14;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar15;
  examples.m_examples.field_2._8_8_ = pRVar16;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffd250;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar17;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar18;
  fun._M_invoker = (_Invoker_type)pRVar19;
  local_2708._M_dataplus._M_p = (pointer)&local_2708.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffd1c0,&stack0xffffffffffffd1c8)),
             description_46,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffd1c8);
  std::__cxx11::string::~string((string *)&local_26e8);
  std::__cxx11::string::~string((string *)&local_2708);
  std::__cxx11::string::~string((string *)&local_2788);
  std::__cxx11::string::~string((string *)&local_27c8);
  std::__cxx11::string::~string((string *)&local_27a8);
  std::__cxx11::string::~string((string *)&local_2728);
  std::__cxx11::string::~string((string *)&local_2768);
  std::__cxx11::string::~string((string *)&local_2748);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2800.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2820);
  RPCResult::~RPCResult(&local_1c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2840);
  lVar7 = 0x14b8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_1740[0].m_type + lVar7));
    lVar7 = lVar7 + -0x88;
  } while (lVar7 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd1f8);
  std::__cxx11::string::~string(local_26c8);
  std::__cxx11::string::~string(local_26a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd218);
  std::__cxx11::string::~string((string *)&local_2648);
  std::__cxx11::string::~string((string *)&local_2668);
  std::__cxx11::string::~string((string *)&local_2688);
  std::__cxx11::string::~string(local_2628);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd238);
  std::__cxx11::string::~string((string *)&local_25c8);
  std::__cxx11::string::~string((string *)&local_25e8);
  std::__cxx11::string::~string((string *)&local_2608);
  std::__cxx11::string::~string(local_25a8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d88);
  RPCResult::~RPCResult(&local_2528);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffd258);
  std::__cxx11::string::~string((string *)&local_2568);
  std::__cxx11::string::~string((string *)&local_2588);
  std::__cxx11::string::~string(local_2548);
  std::__cxx11::string::~string(local_24a0);
  std::__cxx11::string::~string(local_2480);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d48);
  RPCResult::~RPCResult(&local_2420);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d68);
  std::__cxx11::string::~string(local_2460);
  std::__cxx11::string::~string(local_2440);
  std::__cxx11::string::~string(local_2398);
  std::__cxx11::string::~string(local_2378);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d28);
  std::__cxx11::string::~string(local_2358);
  std::__cxx11::string::~string(local_2338);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ce8);
  RPCResult::~RPCResult(&local_22b8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2d08);
  std::__cxx11::string::~string((string *)&local_22f8);
  std::__cxx11::string::~string((string *)&local_2318);
  std::__cxx11::string::~string(local_22d8);
  std::__cxx11::string::~string(local_2230);
  std::__cxx11::string::~string(local_2210);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2cc8);
  std::__cxx11::string::~string(local_21f0);
  std::__cxx11::string::~string(local_21d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ca8);
  std::__cxx11::string::~string(local_21b0);
  std::__cxx11::string::~string(local_2190);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c88);
  std::__cxx11::string::~string(local_2170);
  std::__cxx11::string::~string(local_2150);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c48);
  RPCResult::~RPCResult(&local_20f0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c68);
  std::__cxx11::string::~string(local_2130);
  std::__cxx11::string::~string(local_2110);
  std::__cxx11::string::~string(local_2068);
  std::__cxx11::string::~string(local_2048);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c28);
  std::__cxx11::string::~string((string *)local_2028);
  std::__cxx11::string::~string(local_2008);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2c08);
  std::__cxx11::string::~string(local_1fe8);
  std::__cxx11::string::~string(local_1fc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2be8);
  std::__cxx11::string::~string(local_1fa8);
  std::__cxx11::string::~string(local_1f88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2bc8);
  std::__cxx11::string::~string(local_1f68);
  std::__cxx11::string::~string(local_1f48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ba8);
  std::__cxx11::string::~string(local_1f28);
  std::__cxx11::string::~string(local_1f08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b88);
  std::__cxx11::string::~string(local_1ee8);
  std::__cxx11::string::~string(local_1ec8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b68);
  std::__cxx11::string::~string(local_1ea8);
  std::__cxx11::string::~string(local_1e88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b48);
  std::__cxx11::string::~string(local_1e68);
  std::__cxx11::string::~string(local_1e48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b28);
  std::__cxx11::string::~string(local_1e28);
  std::__cxx11::string::~string(local_1e08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2b08);
  std::__cxx11::string::~string(local_1de8);
  std::__cxx11::string::~string(local_1dc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ae8);
  std::__cxx11::string::~string(local_1da8);
  std::__cxx11::string::~string(local_1d88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2ac8);
  std::__cxx11::string::~string(local_1d68);
  std::__cxx11::string::~string(local_1d48);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2aa8);
  std::__cxx11::string::~string(local_1d28);
  std::__cxx11::string::~string(local_1d08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a88);
  std::__cxx11::string::~string((string *)&local_1cc8);
  std::__cxx11::string::~string((string *)&local_1ce8);
  std::__cxx11::string::~string(local_1ca8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a68);
  std::__cxx11::string::~string(local_1c88);
  std::__cxx11::string::~string(local_1c68);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a48);
  std::__cxx11::string::~string(local_1c48);
  std::__cxx11::string::~string(local_1c28);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a28);
  std::__cxx11::string::~string((string *)&local_1be8);
  std::__cxx11::string::~string((string *)&local_1c08);
  std::__cxx11::string::~string(local_1bc8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2a08);
  std::__cxx11::string::~string((string *)&local_1b88);
  std::__cxx11::string::~string((string *)&local_1ba8);
  std::__cxx11::string::~string(local_1b68);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29e8);
  std::__cxx11::string::~string((string *)&local_1b28);
  std::__cxx11::string::~string((string *)&local_1b48);
  std::__cxx11::string::~string(local_1b08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29c8);
  std::__cxx11::string::~string((string *)&local_1ac8);
  std::__cxx11::string::~string((string *)&local_1ae8);
  std::__cxx11::string::~string(local_1aa8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_29a8);
  std::__cxx11::string::~string(local_1a88);
  std::__cxx11::string::~string(local_1a68);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2968);
  RPCResult::~RPCResult(&local_1a08);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2988);
  std::__cxx11::string::~string(local_1a48);
  std::__cxx11::string::~string(local_1a28);
  std::__cxx11::string::~string(local_1980);
  std::__cxx11::string::~string(local_1960);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2948);
  std::__cxx11::string::~string(local_1940);
  std::__cxx11::string::~string(local_1920);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2928);
  std::__cxx11::string::~string(local_1900);
  std::__cxx11::string::~string(local_18e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2908);
  std::__cxx11::string::~string((string *)&local_1880);
  std::__cxx11::string::~string((string *)&local_18a0);
  std::__cxx11::string::~string((string *)&local_18c0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28e8);
  std::__cxx11::string::~string(local_1860);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28c8);
  std::__cxx11::string::~string(local_1840);
  std::__cxx11::string::~string(local_1820);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_28a8);
  std::__cxx11::string::~string(local_1800);
  std::__cxx11::string::~string(local_17e0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2888);
  std::__cxx11::string::~string(local_17c0);
  std::__cxx11::string::~string(local_17a0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_2868);
  std::__cxx11::string::~string(local_1780);
  std::__cxx11::string::~string(local_1760);
  std::__cxx11::string::~string(local_200);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_27e8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getpeerinfo()
{
    return RPCHelpMan{
        "getpeerinfo",
        "Returns data about each connected network peer as a json array of objects.",
        {},
        RPCResult{
            RPCResult::Type::ARR, "", "",
            {
                {RPCResult::Type::OBJ, "", "",
                {
                    {
                    {RPCResult::Type::NUM, "id", "Peer index"},
                    {RPCResult::Type::STR, "addr", "(host:port) The IP address and port of the peer"},
                    {RPCResult::Type::STR, "addrbind", /*optional=*/true, "(ip:port) Bind address of the connection to the peer"},
                    {RPCResult::Type::STR, "addrlocal", /*optional=*/true, "(ip:port) Local address as reported by the peer"},
                    {RPCResult::Type::STR, "network", "Network (" + Join(GetNetworkNames(/*append_unroutable=*/true), ", ") + ")"},
                    {RPCResult::Type::NUM, "mapped_as", /*optional=*/true, "The AS in the BGP route to the peer used for diversifying\n"
                                                        "peer selection (only available if the asmap config flag is set)"},
                    {RPCResult::Type::STR_HEX, "services", "The services offered"},
                    {RPCResult::Type::ARR, "servicesnames", "the services offered, in human-readable form",
                    {
                        {RPCResult::Type::STR, "SERVICE_NAME", "the service name if it is recognised"}
                    }},
                    {RPCResult::Type::BOOL, "relaytxes", "Whether we relay transactions to this peer"},
                    {RPCResult::Type::NUM_TIME, "lastsend", "The " + UNIX_EPOCH_TIME + " of the last send"},
                    {RPCResult::Type::NUM_TIME, "lastrecv", "The " + UNIX_EPOCH_TIME + " of the last receive"},
                    {RPCResult::Type::NUM_TIME, "last_transaction", "The " + UNIX_EPOCH_TIME + " of the last valid transaction received from this peer"},
                    {RPCResult::Type::NUM_TIME, "last_block", "The " + UNIX_EPOCH_TIME + " of the last block received from this peer"},
                    {RPCResult::Type::NUM, "bytessent", "The total bytes sent"},
                    {RPCResult::Type::NUM, "bytesrecv", "The total bytes received"},
                    {RPCResult::Type::NUM_TIME, "conntime", "The " + UNIX_EPOCH_TIME + " of the connection"},
                    {RPCResult::Type::NUM, "timeoffset", "The time offset in seconds"},
                    {RPCResult::Type::NUM, "pingtime", /*optional=*/true, "The last ping time in milliseconds (ms), if any"},
                    {RPCResult::Type::NUM, "minping", /*optional=*/true, "The minimum observed ping time in milliseconds (ms), if any"},
                    {RPCResult::Type::NUM, "pingwait", /*optional=*/true, "The duration in milliseconds (ms) of an outstanding ping (if non-zero)"},
                    {RPCResult::Type::NUM, "version", "The peer version, such as 70001"},
                    {RPCResult::Type::STR, "subver", "The string version"},
                    {RPCResult::Type::BOOL, "inbound", "Inbound (true) or Outbound (false)"},
                    {RPCResult::Type::BOOL, "bip152_hb_to", "Whether we selected peer as (compact blocks) high-bandwidth peer"},
                    {RPCResult::Type::BOOL, "bip152_hb_from", "Whether peer selected us as (compact blocks) high-bandwidth peer"},
                    {RPCResult::Type::NUM, "startingheight", "The starting height (block) of the peer"},
                    {RPCResult::Type::NUM, "presynced_headers", "The current height of header pre-synchronization with this peer, or -1 if no low-work sync is in progress"},
                    {RPCResult::Type::NUM, "synced_headers", "The last header we have in common with this peer"},
                    {RPCResult::Type::NUM, "synced_blocks", "The last block we have in common with this peer"},
                    {RPCResult::Type::ARR, "inflight", "",
                    {
                        {RPCResult::Type::NUM, "n", "The heights of blocks we're currently asking from this peer"},
                    }},
                    {RPCResult::Type::BOOL, "addr_relay_enabled", "Whether we participate in address relay with this peer"},
                    {RPCResult::Type::NUM, "addr_processed", "The total number of addresses processed, excluding those dropped due to rate limiting"},
                    {RPCResult::Type::NUM, "addr_rate_limited", "The total number of addresses dropped due to rate limiting"},
                    {RPCResult::Type::ARR, "permissions", "Any special permissions that have been granted to this peer",
                    {
                        {RPCResult::Type::STR, "permission_type", Join(NET_PERMISSIONS_DOC, ",\n") + ".\n"},
                    }},
                    {RPCResult::Type::NUM, "minfeefilter", "The minimum fee rate for transactions this peer accepts"},
                    {RPCResult::Type::OBJ_DYN, "bytessent_per_msg", "",
                    {
                        {RPCResult::Type::NUM, "msg", "The total bytes sent aggregated by message type\n"
                                                      "When a message type is not listed in this json object, the bytes sent are 0.\n"
                                                      "Only known message types can appear as keys in the object."}
                    }},
                    {RPCResult::Type::OBJ_DYN, "bytesrecv_per_msg", "",
                    {
                        {RPCResult::Type::NUM, "msg", "The total bytes received aggregated by message type\n"
                                                      "When a message type is not listed in this json object, the bytes received are 0.\n"
                                                      "Only known message types can appear as keys in the object and all bytes received\n"
                                                      "of unknown message types are listed under '"+NET_MESSAGE_TYPE_OTHER+"'."}
                    }},
                    {RPCResult::Type::STR, "connection_type", "Type of connection: \n" + Join(CONNECTION_TYPE_DOC, ",\n") + ".\n"
                                                              "Please note this output is unlikely to be stable in upcoming releases as we iterate to\n"
                                                              "best capture connection behaviors."},
                    {RPCResult::Type::STR, "transport_protocol_type", "Type of transport protocol: \n" + Join(TRANSPORT_TYPE_DOC, ",\n") + ".\n"},
                    {RPCResult::Type::STR, "session_id", "The session ID for this connection, or \"\" if there is none (\"v2\" transport protocol only).\n"},
                }},
            }},
        },
        RPCExamples{
            HelpExampleCli("getpeerinfo", "")
            + HelpExampleRpc("getpeerinfo", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);
    const PeerManager& peerman = EnsurePeerman(node);

    std::vector<CNodeStats> vstats;
    connman.GetNodeStats(vstats);

    UniValue ret(UniValue::VARR);

    for (const CNodeStats& stats : vstats) {
        UniValue obj(UniValue::VOBJ);
        CNodeStateStats statestats;
        bool fStateStats = peerman.GetNodeStateStats(stats.nodeid, statestats);
        // GetNodeStateStats() requires the existence of a CNodeState and a Peer object
        // to succeed for this peer. These are created at connection initialisation and
        // exist for the duration of the connection - except if there is a race where the
        // peer got disconnected in between the GetNodeStats() and the GetNodeStateStats()
        // calls. In this case, the peer doesn't need to be reported here.
        if (!fStateStats) {
            continue;
        }
        obj.pushKV("id", stats.nodeid);
        obj.pushKV("addr", stats.m_addr_name);
        if (stats.addrBind.IsValid()) {
            obj.pushKV("addrbind", stats.addrBind.ToStringAddrPort());
        }
        if (!(stats.addrLocal.empty())) {
            obj.pushKV("addrlocal", stats.addrLocal);
        }
        obj.pushKV("network", GetNetworkName(stats.m_network));
        if (stats.m_mapped_as != 0) {
            obj.pushKV("mapped_as", uint64_t(stats.m_mapped_as));
        }
        ServiceFlags services{statestats.their_services};
        obj.pushKV("services", strprintf("%016x", services));
        obj.pushKV("servicesnames", GetServicesNames(services));
        obj.pushKV("relaytxes", statestats.m_relay_txs);
        obj.pushKV("lastsend", count_seconds(stats.m_last_send));
        obj.pushKV("lastrecv", count_seconds(stats.m_last_recv));
        obj.pushKV("last_transaction", count_seconds(stats.m_last_tx_time));
        obj.pushKV("last_block", count_seconds(stats.m_last_block_time));
        obj.pushKV("bytessent", stats.nSendBytes);
        obj.pushKV("bytesrecv", stats.nRecvBytes);
        obj.pushKV("conntime", count_seconds(stats.m_connected));
        obj.pushKV("timeoffset", Ticks<std::chrono::seconds>(statestats.time_offset));
        if (stats.m_last_ping_time > 0us) {
            obj.pushKV("pingtime", Ticks<SecondsDouble>(stats.m_last_ping_time));
        }
        if (stats.m_min_ping_time < std::chrono::microseconds::max()) {
            obj.pushKV("minping", Ticks<SecondsDouble>(stats.m_min_ping_time));
        }
        if (statestats.m_ping_wait > 0s) {
            obj.pushKV("pingwait", Ticks<SecondsDouble>(statestats.m_ping_wait));
        }
        obj.pushKV("version", stats.nVersion);
        // Use the sanitized form of subver here, to avoid tricksy remote peers from
        // corrupting or modifying the JSON output by putting special characters in
        // their ver message.
        obj.pushKV("subver", stats.cleanSubVer);
        obj.pushKV("inbound", stats.fInbound);
        obj.pushKV("bip152_hb_to", stats.m_bip152_highbandwidth_to);
        obj.pushKV("bip152_hb_from", stats.m_bip152_highbandwidth_from);
        obj.pushKV("startingheight", statestats.m_starting_height);
        obj.pushKV("presynced_headers", statestats.presync_height);
        obj.pushKV("synced_headers", statestats.nSyncHeight);
        obj.pushKV("synced_blocks", statestats.nCommonHeight);
        UniValue heights(UniValue::VARR);
        for (const int height : statestats.vHeightInFlight) {
            heights.push_back(height);
        }
        obj.pushKV("inflight", std::move(heights));
        obj.pushKV("addr_relay_enabled", statestats.m_addr_relay_enabled);
        obj.pushKV("addr_processed", statestats.m_addr_processed);
        obj.pushKV("addr_rate_limited", statestats.m_addr_rate_limited);
        UniValue permissions(UniValue::VARR);
        for (const auto& permission : NetPermissions::ToStrings(stats.m_permission_flags)) {
            permissions.push_back(permission);
        }
        obj.pushKV("permissions", std::move(permissions));
        obj.pushKV("minfeefilter", ValueFromAmount(statestats.m_fee_filter_received));

        UniValue sendPerMsgType(UniValue::VOBJ);
        for (const auto& i : stats.mapSendBytesPerMsgType) {
            if (i.second > 0)
                sendPerMsgType.pushKV(i.first, i.second);
        }
        obj.pushKV("bytessent_per_msg", std::move(sendPerMsgType));

        UniValue recvPerMsgType(UniValue::VOBJ);
        for (const auto& i : stats.mapRecvBytesPerMsgType) {
            if (i.second > 0)
                recvPerMsgType.pushKV(i.first, i.second);
        }
        obj.pushKV("bytesrecv_per_msg", std::move(recvPerMsgType));
        obj.pushKV("connection_type", ConnectionTypeAsString(stats.m_conn_type));
        obj.pushKV("transport_protocol_type", TransportTypeAsString(stats.m_transport_type));
        obj.pushKV("session_id", stats.m_session_id);

        ret.push_back(std::move(obj));
    }

    return ret;
},
    };
}